

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O1

void SituationToFen(Situation *situation,char *fen)

{
  byte bVar1;
  UINT8 *pUVar2;
  char cVar3;
  long lVar4;
  int iVar5;
  char *fent;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  
  pUVar2 = situation->current_board + 0x33;
  lVar4 = 3;
  do {
    lVar7 = 0;
    iVar5 = 0;
    pcVar6 = fen;
    do {
      bVar1 = pUVar2[lVar7];
      if (bVar1 == 0) {
        iVar5 = iVar5 + 1;
      }
      else {
        if (iVar5 != 0) {
          *pcVar6 = (char)iVar5 + '0';
          pcVar6 = pcVar6 + 1;
        }
        pcVar8 = "vector::_M_realloc_insert" + (ulong)bVar1 + 0xb;
        if ((bVar1 & 0x10) != 0) {
          pcVar8 = FEN_OF_PIECE[0] + (bVar1 - 0x10);
        }
        *pcVar6 = *pcVar8;
        pcVar6 = pcVar6 + 1;
        iVar5 = 0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 9);
    if (0 < iVar5) {
      *pcVar6 = (char)iVar5 + '0';
      pcVar6 = pcVar6 + 1;
    }
    *pcVar6 = '/';
    fen = pcVar6 + 1;
    lVar4 = lVar4 + 1;
    pUVar2 = pUVar2 + 0x10;
  } while (lVar4 != 0xd);
  *pcVar6 = ' ';
  cVar3 = 'b';
  if (situation->current_player == 0) {
    cVar3 = 'w';
  }
  pcVar6[1] = cVar3;
  pcVar6[2] = '\0';
  return;
}

Assistant:

void SituationToFen(Situation & situation, char* fen){
    int row, col, piece_id, space_count;
    char *fent = fen;
    for(row = 3; row <= 12; row++){
        space_count = 0;
        for(col = 3; col <= 11; col ++){
            piece_id = situation.current_board[GetPosition(col, row)];
            if(piece_id != 0){
                if(space_count != 0){
                    *fent = space_count + '0';
                    space_count = 0;
                    fent ++;
                }
                if(piece_id & 16){
                    *fent = FEN_OF_PIECE[0][piece_id - 16];
                }
                else{
                    *fent = FEN_OF_PIECE[1][piece_id - 32];
                }
                fent ++;
            }
            else{
                space_count ++;
            }
        }
        if(space_count > 0){
            *fent = space_count + '0';
            fent ++;
        }
        *fent = '/';
        fent ++;
    }
    *(fent - 1) = ' ';
    *fent = (situation.current_player == RED ? 'w' : 'b');
    fent ++;
    *fent = '\0';
}